

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status
fdb_snapshot_open(fdb_kvs_handle *handle_in,fdb_kvs_handle **ptr_handle,fdb_seqnum_t seqnum)

{
  snap_handle *psVar1;
  fdb_log_callback_ex p_Var2;
  fdb_status fVar3;
  fdb_seqnum_t fVar4;
  fdb_kvs_handle *handle;
  kvs_info *pkVar5;
  char *kvs_name;
  filemgr_dirty_update_node *pfVar6;
  filemgr *pfVar7;
  snap_handle **shandle;
  bool bVar8;
  file_status_t fstatus;
  filemgr *local_278;
  fdb_txn *local_270;
  err_log_callback *local_268;
  fdb_kvs_handle **local_260;
  fdb_kvs_handle *local_258;
  char *local_250;
  _fdb_key_cmp_info cmp_info;
  fdb_kvs_config kvs_config;
  fdb_config config;
  snap_handle dummy_shandle;
  
  if (ptr_handle == (fdb_kvs_handle **)0x0 || handle_in == (fdb_kvs_handle *)0x0) {
    return FDB_RESULT_INVALID_HANDLE;
  }
  local_260 = ptr_handle;
  memcpy(&config,&handle_in->config,0xf8);
  kvs_config.custom_cmp_param = (handle_in->kvs_config).custom_cmp_param;
  kvs_config.create_if_missing = (handle_in->kvs_config).create_if_missing;
  kvs_config._1_7_ = *(undefined7 *)&(handle_in->kvs_config).field_0x1;
  kvs_config.custom_cmp = (handle_in->kvs_config).custom_cmp;
  fstatus = '\0';
  local_268 = &handle_in->log_callback;
  local_270 = (fdb_txn *)0x0;
  fVar3 = FDB_RESULT_SUCCESS;
  do {
    if (handle_in->shandle == (snap_handle *)0x0) {
      fdb_check_file_reopen(handle_in,&fstatus);
      fdb_sync_db_header(handle_in);
      pkVar5 = handle_in->kvs;
      pfVar7 = handle_in->file;
      if ((pkVar5 == (kvs_info *)0x0) || (pkVar5->type != '\x01')) {
        fVar4 = filemgr_get_seqnum(pfVar7);
      }
      else {
        fVar4 = fdb_kvs_get_seqnum(pfVar7,pkVar5->id);
      }
      handle_in->seqnum = fVar4;
    }
    else {
      pfVar7 = handle_in->file;
    }
    if ((seqnum != 0xffffffffffffffff) && (handle_in->seqnum < seqnum)) {
      return FDB_RESULT_NO_DB_INSTANCE;
    }
    handle = (fdb_kvs_handle *)calloc(1,0x208);
    if (handle == (fdb_kvs_handle *)0x0) {
      return FDB_RESULT_ALLOC_FAIL;
    }
    LOCK();
    (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
    UNLOCK();
    (handle->log_callback).ctx_data = local_268->ctx_data;
    p_Var2 = local_268->callback_ex;
    (handle->log_callback).callback = local_268->callback;
    (handle->log_callback).callback_ex = p_Var2;
    handle->max_seqnum = seqnum;
    config.flags._0_1_ = (byte)config.flags | 2;
    handle->fhandle = handle_in->fhandle;
    config.compaction_mode = '\0';
    psVar1 = handle_in->shandle;
    local_278 = pfVar7;
    if (psVar1 == (snap_handle *)0x0) {
      bVar8 = true;
    }
    else {
      LOCK();
      (handle->last_hdr_bid).super___atomic_base<unsigned_long>._M_i =
           (handle_in->last_hdr_bid).super___atomic_base<unsigned_long>._M_i;
      UNLOCK();
      fVar3 = wal_snapshot_clone(handle_in->shandle,&handle->shandle,seqnum);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        fdb_log_impl(local_268,2,fVar3,
                     "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                     ,"fdb_snapshot_open",0x421,
                     "Warning: Snapshot clone at sequence number %ludoes not match its snapshot handle %luin file \'%s\'."
                     ,seqnum,handle_in->seqnum,handle_in->file->filename);
        goto LAB_0011bfc4;
      }
      handle->max_seqnum = 0xffffffffffffffff;
      bVar8 = handle->shandle == (snap_handle *)0x0;
      fVar3 = FDB_RESULT_SUCCESS;
    }
    cmp_info.kvs_config.custom_cmp_param = (handle_in->kvs_config).custom_cmp_param;
    cmp_info.kvs_config.create_if_missing = (handle_in->kvs_config).create_if_missing;
    cmp_info.kvs_config._1_7_ = *(undefined7 *)&(handle_in->kvs_config).field_0x1;
    cmp_info.kvs_config.custom_cmp = (handle_in->kvs_config).custom_cmp;
    pkVar5 = handle_in->kvs;
    shandle = &handle->shandle;
    cmp_info.kvs = pkVar5;
    if (bVar8) {
      local_270 = handle_in->fhandle->root->txn;
      if (local_270 == (fdb_txn *)0x0) {
        local_270 = &handle_in->file->global_txn;
      }
      if (seqnum == 0xffffffffffffffff) {
        memset(&dummy_shandle,0,0xe0);
        *shandle = &dummy_shandle;
      }
      else {
        fVar3 = wal_dur_snapshot_open(seqnum,&cmp_info,local_278,local_270,shandle);
      }
      if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_0011bfc4:
        free(handle);
        return fVar3;
      }
      pkVar5 = handle_in->kvs;
    }
    pfVar7 = local_278;
    if (pkVar5 == (kvs_info *)0x0) {
      if (psVar1 == (snap_handle *)0x0) {
        fVar3 = _fdb_open(handle,local_278->filename,FDB_AFILENAME,&config);
      }
      else {
        fVar3 = _fdb_clone_snapshot(handle_in,handle);
      }
    }
    else if (psVar1 == (snap_handle *)0x0) {
      local_258 = pkVar5->root;
      local_250 = local_278->filename;
      kvs_name = _fdb_kvs_get_name(handle_in,local_278);
      fVar3 = _fdb_kvs_open(local_258,&config,&kvs_config,pfVar7,local_250,kvs_name,handle);
    }
    else {
      fVar3 = _fdb_kvs_clone_snapshot(handle_in,handle);
    }
    if (fVar3 == FDB_RESULT_SUCCESS) {
      if (seqnum == 0xffffffffffffffff) {
        if (handle_in->shandle == (snap_handle *)0x0) {
          handle->max_seqnum = handle_in->seqnum;
          pfVar6 = filemgr_dirty_update_get_latest(handle->file);
          handle->bhandle->dirty_update = pfVar6;
          if (pfVar6 != (filemgr_dirty_update_node *)0x0) {
            _fdb_import_dirty_root(handle,pfVar6->idtree_root,pfVar6->seqtree_root);
            btreeblk_discard_blocks(handle->bhandle);
          }
          pfVar7 = local_278;
          fVar3 = wal_dur_snapshot_open(handle->seqnum,&cmp_info,local_278,local_270,shandle);
          if (fVar3 == FDB_RESULT_SUCCESS) {
            fVar3 = wal_copyto_snapshot(pfVar7,*shandle,handle_in->kvs != (kvs_info *)0x0);
          }
        }
        else {
          fVar3 = FDB_RESULT_SUCCESS;
          if (psVar1 != (snap_handle *)0x0) {
            handle->max_seqnum = handle_in->seqnum;
            handle->trie->root_bid = handle_in->trie->root_bid;
            if ((handle->config).seqtree_opt == '\x01') {
              ((handle->field_6).seqtree)->root_bid = ((handle_in->field_6).seqtree)->root_bid;
            }
            btreeblk_discard_blocks(handle->bhandle);
            pfVar6 = handle_in->bhandle->dirty_update;
            filemgr_dirty_update_inc_ref_count(pfVar6);
            handle->bhandle->dirty_update = pfVar6;
            fVar3 = FDB_RESULT_SUCCESS;
          }
        }
      }
      else {
        fVar3 = FDB_RESULT_SUCCESS;
        if (psVar1 != (snap_handle *)0x0) {
          handle->max_seqnum = handle_in->seqnum;
        }
      }
      *local_260 = handle;
      return fVar3;
    }
    *local_260 = (fdb_kvs_handle *)0x0;
    if (seqnum != 0xffffffffffffffff || psVar1 != (snap_handle *)0x0) {
      wal_snapshot_close(handle->shandle,handle->file);
    }
    free(handle);
    if (fVar3 != FDB_RESULT_NO_DB_INSTANCE) {
      return fVar3;
    }
    if (fstatus != '\x01') {
      return FDB_RESULT_NO_DB_INSTANCE;
    }
    fVar3 = FDB_RESULT_NO_DB_INSTANCE;
    if ((local_278->status).super___atomic_base<unsigned_char>._M_i != '\x04') {
      return FDB_RESULT_NO_DB_INSTANCE;
    }
  } while( true );
}

Assistant:

LIBFDB_API
fdb_status fdb_snapshot_open(fdb_kvs_handle *handle_in,
                             fdb_kvs_handle **ptr_handle, fdb_seqnum_t seqnum)
{
#ifdef _MEMPOOL
    mempool_init();
#endif

    if (!handle_in || !ptr_handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    fdb_config config = handle_in->config;
    fdb_kvs_config kvs_config = handle_in->kvs_config;
    fdb_kvs_id_t kv_id = 0;
    fdb_kvs_handle *handle;
    fdb_txn *txn = NULL;
    fdb_status fs = FDB_RESULT_SUCCESS;
    filemgr *file;
    file_status_t fstatus = FILE_NORMAL;
    struct snap_handle dummy_shandle;
    struct _fdb_key_cmp_info cmp_info;
    LATENCY_STAT_START();

fdb_snapshot_open_start:
    if (!handle_in->shandle) {
        fdb_check_file_reopen(handle_in, &fstatus);
        fdb_sync_db_header(handle_in);
        file = handle_in->file;

        if (handle_in->kvs && handle_in->kvs->type == KVS_SUB) {
            handle_in->seqnum = fdb_kvs_get_seqnum(file,
                                                   handle_in->kvs->id);
        } else {
            handle_in->seqnum = filemgr_get_seqnum(file);
        }
    } else {
        file = handle_in->file;
    }

    // if the max sequence number seen by this handle is lower than the
    // requested snapshot marker, it means the snapshot is not yet visible
    // even via the current fdb_kvs_handle
    if (seqnum != FDB_SNAPSHOT_INMEM && seqnum > handle_in->seqnum) {
        return FDB_RESULT_NO_DB_INSTANCE;
    }

    handle = (fdb_kvs_handle *) calloc(1, sizeof(fdb_kvs_handle));
    if (!handle) { // LCOV_EXCL_START
        return FDB_RESULT_ALLOC_FAIL;
    } // LCOV_EXCL_STOP

    atomic_init_uint8_t(&handle->handle_busy, 0);
    handle->log_callback = handle_in->log_callback;
    handle->max_seqnum = seqnum;
    handle->fhandle = handle_in->fhandle;

    config.flags |= FDB_OPEN_FLAG_RDONLY;
    // do not perform compaction for snapshot
    config.compaction_mode = FDB_COMPACTION_MANUAL;

    // If cloning an existing snapshot handle, then rewind indexes
    // to its last DB header and point its avl tree to existing snapshot's tree
    bool clone_snapshot = false;
    if (handle_in->shandle) {
        atomic_store_uint64_t(&handle->last_hdr_bid,  // do fast rewind
                              atomic_get_uint64_t(&handle_in->last_hdr_bid));
        fs = wal_snapshot_clone(handle_in->shandle, &handle->shandle, seqnum);
        if (fs == FDB_RESULT_SUCCESS) {
            clone_snapshot = true;
            handle->max_seqnum = FDB_SNAPSHOT_INMEM; // temp value to skip WAL
        } else {
            fdb_log(&handle_in->log_callback, FDB_LOG_ERROR, fs,
                    "Warning: Snapshot clone at sequence number %" _F64
                    "does not match its snapshot handle %" _F64
                    "in file '%s'.", seqnum, handle_in->seqnum,
                    handle_in->file->filename);
            free(handle);
            return fs;
        }
    }

    cmp_info.kvs_config = handle_in->kvs_config;
    cmp_info.kvs = handle_in->kvs;

    if (!handle->shandle) {
        txn = handle_in->fhandle->root->txn;
        if (!txn) {
            txn = &handle_in->file->global_txn;
        }
        if (handle_in->kvs) {
            kv_id = handle_in->kvs->id;
        }
        if (seqnum == FDB_SNAPSHOT_INMEM) {
            memset(&dummy_shandle, 0, sizeof(struct snap_handle));
            // tmp value to denote snapshot & not rollback to _fdb_open
            handle->shandle = &dummy_shandle; // dummy
        } else {
            fs = wal_dur_snapshot_open(seqnum, &cmp_info, file, txn,
                                       &handle->shandle);
        }
        if (fs != FDB_RESULT_SUCCESS) {
            free(handle);
            return fs;
        }
    }

    if (handle_in->kvs) {
        // sub-handle in multi KV instance mode
        if (clone_snapshot) {
            fs = _fdb_kvs_clone_snapshot(handle_in, handle);
        } else {
            fs = _fdb_kvs_open(handle_in->kvs->root,
                              &config, &kvs_config, file,
                              file->filename,
                              _fdb_kvs_get_name(handle_in, file),
                              handle);
        }
    } else {
        if (clone_snapshot) {
            fs = _fdb_clone_snapshot(handle_in, handle);
        } else {
            fs = _fdb_open(handle, file->filename, FDB_AFILENAME, &config);
        }
    }

    if (fs == FDB_RESULT_SUCCESS) {
        if (seqnum == FDB_SNAPSHOT_INMEM &&
            !handle_in->shandle) {
            handle->max_seqnum = handle_in->seqnum;

            // synchronize dirty root nodes if exist
            bid_t dirty_idtree_root = BLK_NOT_FOUND;
            bid_t dirty_seqtree_root = BLK_NOT_FOUND;
            struct filemgr_dirty_update_node *dirty_update;

            dirty_update = filemgr_dirty_update_get_latest(handle->file);
            btreeblk_set_dirty_update(handle->bhandle, dirty_update);

            if (dirty_update) {
                filemgr_dirty_update_get_root(handle->file, dirty_update,
                                       &dirty_idtree_root, &dirty_seqtree_root);
                _fdb_import_dirty_root(handle, dirty_idtree_root,
                                       dirty_seqtree_root);
                btreeblk_discard_blocks(handle->bhandle);
            }
            // Having synced the dirty root, make an in-memory WAL snapshot
            // TODO: Re-enable WAL sharing once ready...
#ifdef _MVCC_WAL_ENABLE
            fs = wal_snapshot_open(handle->file, txn, kv_id, seqnum,
                                   &cmp_info, &handle->shandle);
#else
            fs = wal_dur_snapshot_open(handle->seqnum, &cmp_info, file, txn,
                                       &handle->shandle);
            if (fs == FDB_RESULT_SUCCESS) {
                fs = wal_copyto_snapshot(file, handle->shandle,
                                        (bool)handle_in->kvs);
            }
            (void)kv_id;
#endif // _MVCC_WAL_ENABLE
        } else if (clone_snapshot) {
            // Snapshot is created on the other snapshot handle

            handle->max_seqnum = handle_in->seqnum;

            if (seqnum == FDB_SNAPSHOT_INMEM) {
                // in-memory snapshot
                // Clone dirty root nodes from the source snapshot by incrementing
                // their ref counters
                handle->trie->root_bid = handle_in->trie->root_bid;
                if (handle->config.seqtree_opt == FDB_SEQTREE_USE) {
                    if (handle->kvs) {
                        handle->seqtrie->root_bid = handle_in->seqtrie->root_bid;
                    } else {
                        handle->seqtree->root_bid = handle_in->seqtree->root_bid;
                    }
                }
                btreeblk_discard_blocks(handle->bhandle);

                // increase ref count for dirty update
                struct filemgr_dirty_update_node *dirty_update;
                dirty_update = btreeblk_get_dirty_update(handle_in->bhandle);
                filemgr_dirty_update_inc_ref_count(dirty_update);
                btreeblk_set_dirty_update(handle->bhandle, dirty_update);
            }
        }
        *ptr_handle = handle;
    } else {
        *ptr_handle = NULL;
        if (clone_snapshot || seqnum != FDB_SNAPSHOT_INMEM) {
            wal_snapshot_close(handle->shandle, handle->file);
        }
        free(handle);
        // If compactor thread had finished compaction just before this routine
        // calls _fdb_open, then it is possible that the snapshot's DB header
        // is only present in the new_file. So we must retry the snapshot
        // open attempt IFF _fdb_open indicates FDB_RESULT_NO_DB_INSTANCE..
        if (fs == FDB_RESULT_NO_DB_INSTANCE && fstatus == FILE_COMPACT_OLD) {
            if (filemgr_get_file_status(file) == FILE_REMOVED_PENDING) {
                goto fdb_snapshot_open_start;
            }
        }
    }

    if (handle_in->shandle) {
        LATENCY_STAT_END(file, FDB_LATENCY_SNAP_CLONE);
    } else if (seqnum == FDB_SNAPSHOT_INMEM) {
        LATENCY_STAT_END(file, FDB_LATENCY_SNAP_INMEM);
    } else {
        LATENCY_STAT_END(file, FDB_LATENCY_SNAP_DUR);
    }
    return fs;
}